

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaggageRestrictionManager.cpp
# Opt level: O1

void __thiscall
jaegertracing::thrift::BaggageRestrictionManagerClient::recv_getBaggageRestrictions
          (BaggageRestrictionManagerClient *this,
          vector<jaegertracing::thrift::BaggageRestriction,_std::allocator<jaegertracing::thrift::BaggageRestriction>_>
          *_return)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int iVar3;
  TException *this_00;
  TApplicationException *this_01;
  int *__nbytes;
  void *__buf;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *__buf_00;
  TMessageType mtype;
  int32_t rseqid;
  BaggageRestrictionManager_getBaggageRestrictions_presult result;
  TApplicationException x;
  string fname;
  int local_98 [2];
  BaggageRestrictionManager_getBaggageRestrictions_presult local_90;
  undefined1 local_78 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  TApplicationExceptionType local_50;
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38 [16];
  
  __nbytes = local_98 + 1;
  local_98[1] = 0;
  local_40 = 0;
  local_38[0] = 0;
  local_48 = local_38;
  (*this->iprot_->_vptr_TProtocol[0x17])(this->iprot_,&local_48,local_98);
  if (local_98[0] != 2) {
    if (local_98[0] == 3) {
      local_78._8_8_ = &local_60;
      local_78._16_8_ = 0;
      local_60._M_local_buf[0] = '\0';
      local_78._0_8_ = &PTR__TException_002687e0;
      local_50 = UNKNOWN;
      apache::thrift::TApplicationException::read
                ((TApplicationException *)local_78,(int)this->iprot_,__buf,0x2687e0);
      (*this->iprot_->_vptr_TProtocol[0x18])();
      peVar1 = (this->iprot_->ptrans_).
               super___shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      p_Var2 = (this->iprot_->ptrans_).
               super___shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
      }
      (*peVar1->_vptr_TTransport[8])();
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
      this_01 = (TApplicationException *)__cxa_allocate_exception(0x30);
      apache::thrift::TApplicationException::TApplicationException
                (this_01,(TApplicationException *)local_78);
      __cxa_throw(this_01,&apache::thrift::TApplicationException::typeinfo,
                  apache::thrift::TException::~TException);
    }
    (*this->iprot_->_vptr_TProtocol[0x2c])(this->iprot_,0xc);
    (*this->iprot_->_vptr_TProtocol[0x18])();
    peVar1 = (this->iprot_->ptrans_).
             super___shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var2 = (this->iprot_->ptrans_).
             super___shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    (*peVar1->_vptr_TTransport[8])();
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
  }
  iVar3 = std::__cxx11::string::compare((char *)&local_48);
  __buf_00 = extraout_RDX;
  if (iVar3 != 0) {
    (*this->iprot_->_vptr_TProtocol[0x2c])(this->iprot_,0xc);
    (*this->iprot_->_vptr_TProtocol[0x18])();
    peVar1 = (this->iprot_->ptrans_).
             super___shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var2 = (this->iprot_->ptrans_).
             super___shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    (*peVar1->_vptr_TTransport[8])();
    __buf_00 = extraout_RDX_00;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      __buf_00 = extraout_RDX_01;
    }
  }
  local_90._vptr_BaggageRestrictionManager_getBaggageRestrictions_presult =
       (_func_int **)&PTR__BaggageRestrictionManager_getBaggageRestrictions_presult_00268e60;
  local_90.__isset =
       (_BaggageRestrictionManager_getBaggageRestrictions_presult__isset)
       ((byte)local_90.__isset & 0xfe);
  local_90.success = _return;
  BaggageRestrictionManager_getBaggageRestrictions_presult::read
            (&local_90,(int)this->iprot_,__buf_00,(size_t)__nbytes);
  (*this->iprot_->_vptr_TProtocol[0x18])();
  peVar1 = (this->iprot_->ptrans_).
           super___shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var2 = (this->iprot_->ptrans_).
           super___shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  (*peVar1->_vptr_TTransport[8])();
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  if (((byte)local_90.__isset & 1) != 0) {
    BaggageRestrictionManager_getBaggageRestrictions_presult::
    ~BaggageRestrictionManager_getBaggageRestrictions_presult(&local_90);
    if (local_48 != local_38) {
      operator_delete(local_48);
    }
    return;
  }
  this_00 = (TException *)__cxa_allocate_exception(0x30);
  local_78._0_8_ = local_78 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,"getBaggageRestrictions failed: unknown result","");
  apache::thrift::TException::TException(this_00,(string *)local_78);
  *(undefined ***)this_00 = &PTR__TException_002687e0;
  *(undefined4 *)(this_00 + 1) = 5;
  __cxa_throw(this_00,&apache::thrift::TApplicationException::typeinfo,
              apache::thrift::TException::~TException);
}

Assistant:

void BaggageRestrictionManagerClient::recv_getBaggageRestrictions(std::vector<BaggageRestriction> & _return)
{

  int32_t rseqid = 0;
  std::string fname;
  ::apache::thrift::protocol::TMessageType mtype;

  iprot_->readMessageBegin(fname, mtype, rseqid);
  if (mtype == ::apache::thrift::protocol::T_EXCEPTION) {
    ::apache::thrift::TApplicationException x;
    x.read(iprot_);
    iprot_->readMessageEnd();
    iprot_->getTransport()->readEnd();
    throw x;
  }
  if (mtype != ::apache::thrift::protocol::T_REPLY) {
    iprot_->skip(::apache::thrift::protocol::T_STRUCT);
    iprot_->readMessageEnd();
    iprot_->getTransport()->readEnd();
  }
  if (fname.compare("getBaggageRestrictions") != 0) {
    iprot_->skip(::apache::thrift::protocol::T_STRUCT);
    iprot_->readMessageEnd();
    iprot_->getTransport()->readEnd();
  }
  BaggageRestrictionManager_getBaggageRestrictions_presult result;
  result.success = &_return;
  result.read(iprot_);
  iprot_->readMessageEnd();
  iprot_->getTransport()->readEnd();

  if (result.__isset.success) {
    // _return pointer has now been filled
    return;
  }
  throw ::apache::thrift::TApplicationException(::apache::thrift::TApplicationException::MISSING_RESULT, "getBaggageRestrictions failed: unknown result");
}